

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GregorianCalendar.cpp
# Opt level: O0

GregorianCalendar * __thiscall
GregorianCalendar::NthXday
          (GregorianCalendar *__return_storage_ptr__,GregorianCalendar *this,int n,int x,int month,
          int year,int day)

{
  int iVar1;
  undefined1 local_58 [4];
  int date;
  GregorianCalendar calendar_1;
  GregorianCalendar calendar;
  int year_local;
  int month_local;
  int x_local;
  int n_local;
  GregorianCalendar *this_local;
  
  if (n < 1) {
    if (day == 0) {
      day = LastMonthDay(month,year);
    }
    GregorianCalendar((GregorianCalendar *)local_58,month,day,year);
    iVar1 = operator_cast_to_int((GregorianCalendar *)local_58);
    iVar1 = General::XdayOnOrBefore(iVar1,x);
    GregorianCalendar(__return_storage_ptr__,(n + 1) * 7 + iVar1);
  }
  else {
    if (day == 0) {
      day = 1;
    }
    GregorianCalendar((GregorianCalendar *)&calendar_1.super_Calendar.day,month,day,year);
    iVar1 = operator_cast_to_int((GregorianCalendar *)&calendar_1.super_Calendar.day);
    iVar1 = General::XdayOnOrBefore(iVar1 + 6,x);
    GregorianCalendar(__return_storage_ptr__,(n + -1) * 7 + iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

GregorianCalendar GregorianCalendar::NthXday(int n, int x, int month, int year, int day) {
    if (n > 0) {
        if (day == 0) {
            day = 1;
        }
        GregorianCalendar calendar =
                GregorianCalendar(month, day, year);
       
        return
                GregorianCalendar
                        ((7 * (n - 1)) + General::XdayOnOrBefore(6 + calendar, x));
    }
    else {
        if (day == 0) {
            day = LastMonthDay(month, year);
        }
        GregorianCalendar calendar =
                GregorianCalendar(month, day, year);
        int date = (7 * (n + 1)) +
                General::XdayOnOrBefore(calendar, x);
        return GregorianCalendar(date);
    }
}